

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall
MakefileGenerator::writeMakeQmake(MakefileGenerator *this,QTextStream *t,bool noDummyQmakeAll)

{
  QMakeProject *this_00;
  QArrayData *pQVar1;
  QString string;
  QString file;
  int *piVar2;
  undefined8 uVar3;
  qsizetype qVar4;
  bool bVar5;
  char cVar6;
  QTextStream *pQVar7;
  ProStringList *pPVar8;
  undefined4 uVar9;
  undefined7 in_register_00000011;
  long lVar10;
  QMakeLocalFileName *pQVar11;
  QMakeProject *pQVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QStringView config;
  undefined4 in_stack_fffffffffffffe68;
  QArrayData *in_stack_fffffffffffffe70;
  ProString *in_stack_fffffffffffffe78;
  QMakeLocalFileName *pQStack_180;
  QString local_178;
  undefined1 local_160 [24];
  ProKey local_148;
  QString local_118;
  QString local_f8;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  ProKey local_b8;
  undefined1 local_88 [32];
  char (*local_68) [11];
  QString local_58;
  long local_38;
  
  uVar9 = (undefined4)CONCAT71(in_register_00000011,noDummyQmakeAll);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::fileName();
  fileFixify(&local_58,this,(QString *)local_88,(FileFixifyTypes)0x0,true);
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
         (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i +
         -1;
    UNLOCK();
    if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i ==
        0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  pQVar12 = this->project;
  ProKey::ProKey((ProKey *)local_88,"QMAKE_FAILED_REQUIREMENTS");
  bVar5 = QMakeProject::isEmpty(pQVar12,(ProKey *)local_88);
  if (bVar5) {
    pQVar12 = this->project;
    ProKey::ProKey(&local_b8,"QMAKE_INTERNAL_PRL_FILE");
    bVar5 = QMakeProject::isEmpty(pQVar12,&local_b8);
    bVar5 = !bVar5;
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar5 = false;
  }
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
         (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i +
         -1;
    UNLOCK();
    if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i ==
        0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (bVar5) {
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    fileFixify((QStringList *)local_88,this,&Option::mkfile::project_files,(FileFixifyTypes)0x0,true
              );
    escapeFilePaths((QStringList *)local_d8,this,(QStringList *)local_88);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
    pQVar12 = this->project;
    ProKey::ProKey(&local_148,"QMAKE_INTERNAL_PRL_FILE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar12->super_QMakeEvaluator,&local_148);
    ProString::toQString(&local_118,(ProString *)local_88);
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_f8,this,&local_118);
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_f8);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,": \n\t");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"@$(QMAKE) -prl ");
    local_178.d.d._0_2_ = 0x20;
    QtPrivate::QStringList_join((QList *)local_160,(QChar *)local_d8,(longlong)&local_178);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_160);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,' ');
    buildArgs(&local_178,this,true);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_178);
    Qt::endl(pQVar7);
    piVar2 = (int *)CONCAT62(local_178.d.d._2_6_,local_178.d.d._0_2_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT62(local_178.d.d._2_6_,local_178.d.d._0_2_),2,0x10);
      }
    }
    if ((QArrayData *)local_160._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_160._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_160._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_160._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_160._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
      super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
           super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeProject *)local_118.d.d != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
      super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
           super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
           + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((ProString *)local_148.super_ProString.m_string.d.d != (ProString *)0x0) {
      LOCK();
      ((__atomic_base<int> *)
      &(((QString *)&(local_148.super_ProString.m_string.d.d)->super_QArrayData)->d).d)->_M_i =
           ((__atomic_base<int> *)
           &(((QString *)&(local_148.super_ProString.m_string.d.d)->super_QArrayData)->d).d)->_M_i +
           -1;
      UNLOCK();
      if (((__atomic_base<int> *)
          &(((QString *)&(local_148.super_ProString.m_string.d.d)->super_QArrayData)->d).d)->_M_i ==
          0) {
        QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_d8);
  }
  pQVar12 = (QMakeProject *)local_d8;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  fullBuildArgs((QString *)&local_148,this);
  local_88._24_8_ = local_148.super_ProString.m_string.d.size;
  local_88._16_8_ = local_148.super_ProString.m_string.d.ptr;
  local_88._8_8_ = local_148.super_ProString.m_string.d.d;
  local_88._0_8_ = anon_var_dwarf_158173;
  local_148.super_ProString.m_string.d.d = (Data *)0x0;
  local_148.super_ProString.m_string.d.ptr = (char16_t *)0x0;
  local_148.super_ProString.m_string.d.size = 0;
  QStringBuilder<const_char_(&)[9],_QString>::convertTo<QString>
            ((QString *)pQVar12,(QStringBuilder<const_char_(&)[9],_QString> *)local_88);
  if ((ProString *)local_88._8_8_ != (ProString *)0x0) {
    LOCK();
    ((__atomic_base<int> *)&(((QString *)local_88._8_8_)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)local_88._8_8_)->d).d)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)&(((QString *)local_88._8_8_)->d).d)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
    }
  }
  if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  qVar4 = local_58.d.size;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
    bVar5 = false;
  }
  else {
    this_00 = this->project;
    QVar13.m_data = &DAT_0000000c;
    QVar13.m_size = (qsizetype)local_88;
    QString::fromUtf8(QVar13);
    pQVar12 = (QMakeProject *)local_88._0_8_;
    config.m_data = (storage_type_conflict *)local_88._8_8_;
    config.m_size = local_88._16_8_;
    bVar5 = QMakeEvaluator::isActiveConfig(&this_00->super_QMakeEvaluator,config,false);
    bVar5 = !bVar5;
  }
  if (pQVar12 != (QMakeProject *)0x0 && (undefined1 *)qVar4 != (undefined1 *)0x0) {
    LOCK();
    (((Type *)&(pQVar12->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i =
         (((Type *)&(pQVar12->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if ((((Type *)&(pQVar12->super_QMakeEvaluator).m_caller)->super___atomic_base<int>)._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pQVar12,2,0x10);
    }
  }
  if (bVar5) {
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(local_88,this,&local_58);
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,": ");
    pQVar12 = this->project;
    local_118.d.d = (pQVar12->m_projectFile).d.d;
    local_118.d.ptr = (pQVar12->m_projectFile).d.ptr;
    local_118.d.size = (pQVar12->m_projectFile).d.size;
    if ((QMakeProject *)local_118.d.d != (QMakeProject *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(((QMakeProject *)local_118.d.d)->super_QMakeEvaluator).m_caller)->
      _q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(((QMakeProject *)local_118.d.d)->super_QMakeEvaluator).m_caller)->
           _q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    fileFixify(&local_f8,this,&local_118,(FileFixifyTypes)0x0,true);
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_148,this,&local_f8);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_148);
    QTextStream::operator<<(pQVar7," ");
    if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
      super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
           super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeProject *)local_118.d.d != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
      super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
           super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
           + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if (Option::globals->do_cache == true) {
      pQVar1 = &((this->project->super_QMakeEvaluator).m_conffile.d.d)->super_QArrayData;
      lVar10 = (this->project->super_QMakeEvaluator).m_conffile.d.size;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (lVar10 != 0) {
        pQVar12 = this->project;
        local_f8.d.d = (pQVar12->super_QMakeEvaluator).m_conffile.d.d;
        local_f8.d.ptr = (pQVar12->super_QMakeEvaluator).m_conffile.d.ptr;
        local_f8.d.size = (pQVar12->super_QMakeEvaluator).m_conffile.d.size;
        if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(((QMakeProject *)local_f8.d.d)->super_QMakeEvaluator).m_caller)->
          _q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(((QMakeProject *)local_f8.d.d)->super_QMakeEvaluator).m_caller
                )->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        fileFixify((QString *)&local_148,this,&local_f8,(FileFixifyTypes)0x0,true);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                  (local_88,this,&local_148);
        pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
        QTextStream::operator<<(pQVar7," ");
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
               (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
               _M_i + -1;
          UNLOCK();
          if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
              _M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
          LOCK();
          (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i =
               (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
               super___atomic_base<int>)._M_i + -1;
          UNLOCK();
          if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
              super___atomic_base<int>)._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      pQVar1 = &((this->project->super_QMakeEvaluator).m_cachefile.d.d)->super_QArrayData;
      lVar10 = (this->project->super_QMakeEvaluator).m_cachefile.d.size;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (lVar10 != 0) {
        pQVar12 = this->project;
        local_f8.d.d = (pQVar12->super_QMakeEvaluator).m_cachefile.d.d;
        local_f8.d.ptr = (pQVar12->super_QMakeEvaluator).m_cachefile.d.ptr;
        local_f8.d.size = (pQVar12->super_QMakeEvaluator).m_cachefile.d.size;
        if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(((QMakeProject *)local_f8.d.d)->super_QMakeEvaluator).m_caller)->
          _q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(((QMakeProject *)local_f8.d.d)->super_QMakeEvaluator).m_caller
                )->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        fileFixify((QString *)&local_148,this,&local_f8,(FileFixifyTypes)0x0,true);
        (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                  (local_88,this,&local_148);
        pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
        QTextStream::operator<<(pQVar7," ");
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
               (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
               _M_i + -1;
          UNLOCK();
          if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
              _M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
          LOCK();
          (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i =
               (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
               super___atomic_base<int>)._M_i + -1;
          UNLOCK();
          if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
              super___atomic_base<int>)._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    specdir((QString *)local_88,this);
    uVar3 = local_88._16_8_;
    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
           + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((ProString *)uVar3 != (ProString *)0x0) {
      specdir(&local_118,this);
      local_88._16_8_ = local_118.d.size;
      local_88._8_8_ = local_118.d.ptr;
      local_88._0_8_ = local_118.d.d;
      local_118.d.d = (Data *)0x0;
      local_118.d.ptr = (char16_t *)0x0;
      local_118.d.size = 0;
      local_88._24_8_ = "/qmake.conf";
      QStringBuilder<QString,_const_char_(&)[12]>::convertTo<QString>
                (&local_f8,(QStringBuilder<QString,_const_char_(&)[12]> *)local_88);
      local_148.super_ProString.m_string.d.d = local_f8.d.d;
      local_148.super_ProString.m_string.d.ptr = local_f8.d.ptr;
      local_148.super_ProString.m_string.d.size = local_f8.d.size;
      if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
        super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
             super___atomic_base<int>)._M_i + 1;
        UNLOCK();
      }
      string.d.d._4_4_ = uVar9;
      string.d.d._0_4_ = in_stack_fffffffffffffe68;
      string.d.ptr = (char16_t *)in_stack_fffffffffffffe70;
      string.d.size = (qsizetype)in_stack_fffffffffffffe78;
      Option::fixString((QString *)&stack0xfffffffffffffe70,string,(uchar)&local_148);
      if ((QMakeProject *)local_148.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)&(local_148.super_ProString.m_string.d.d)->super_QArrayData)->
                   m_caller)->super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)
                        &(local_148.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->
             super___atomic_base<int>)._M_i + -1;
        UNLOCK();
        if ((((Type *)&((QMakeEvaluator *)
                       &(local_148.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->
            super___atomic_base<int>)._M_i == 0) {
          QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      local_148.super_ProString.m_string.d.size = (qsizetype)pQStack_180;
      if (in_stack_fffffffffffffe70 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffe70->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffe70->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      file.d.d._4_4_ = uVar9;
      file.d.d._0_4_ = in_stack_fffffffffffffe68;
      file.d.ptr = (char16_t *)in_stack_fffffffffffffe70;
      file.d.size = (qsizetype)in_stack_fffffffffffffe78;
      local_148.super_ProString.m_string.d.d = (Data *)in_stack_fffffffffffffe70;
      local_148.super_ProString.m_string.d.ptr = (char16_t *)in_stack_fffffffffffffe78;
      fileInfo((MakefileGenerator *)local_160,file);
      cVar6 = QFileInfo::exists();
      QFileInfo::~QFileInfo((QFileInfo *)local_160);
      if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (in_stack_fffffffffffffe70 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffe70->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffe70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((in_stack_fffffffffffffe70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(in_stack_fffffffffffffe70,2,0x10);
        }
      }
      if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
        super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
             super___atomic_base<int>)._M_i + -1;
        UNLOCK();
        if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
            super___atomic_base<int>)._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
             _M_i + -1;
        UNLOCK();
        if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_118.d.d != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
        super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
             super___atomic_base<int>)._M_i + -1;
        UNLOCK();
        if ((((Type *)&((QMakeEvaluator *)&(local_118.d.d)->super_QArrayData)->m_caller)->
            super___atomic_base<int>)._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar6 != '\0') {
        specdir(&local_f8,this);
        local_88._16_8_ = local_f8.d.size;
        local_88._8_8_ = local_f8.d.ptr;
        local_88._0_8_ = local_f8.d.d;
        local_f8.d.size = 0;
        local_f8.d.d = (Data *)0x0;
        local_f8.d.ptr = (char16_t *)0x0;
        local_88._24_8_ = &Option::dir_sep;
        local_68 = (char (*) [11])0x2b330c;
        escapeDependencyPath<QStringBuilder<QString,QString&>,char_const(&)[11]>
                  ((QString *)&local_148,this,
                   (QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *)
                   local_88);
        pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_148);
        QTextStream::operator<<(pQVar7," ");
        if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
               (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
               _M_i + -1;
          UNLOCK();
          if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
              _M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
          LOCK();
          (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i =
               (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
               super___atomic_base<int>)._M_i + -1;
          UNLOCK();
          if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
              super___atomic_base<int>)._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    pQVar12 = this->project;
    ProKey::ProKey((ProKey *)local_88,"QMAKE_INTERNAL_INCLUDED_FILES");
    pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_88);
    escapeDependencyPaths((ProStringList *)&local_148,this,pPVar8);
    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
           + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    QVar14.m_data = (storage_type *)0x5;
    QVar14.m_size = (qsizetype)local_88;
    QString::fromUtf8(QVar14);
    local_f8.d.d = (Data *)local_88._0_8_;
    local_f8.d.ptr = (char16_t *)local_88._8_8_;
    local_f8.d.size = local_88._16_8_;
    ProStringList::join((QString *)local_88,(ProStringList *)&local_148,&local_f8);
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"\n\t");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_d8);
    Qt::endl(pQVar7);
    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
           + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
      super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
           super___atomic_base<int>)._M_i + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
          super___atomic_base<int>)._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar12 = this->project;
    ProKey::ProKey((ProKey *)local_88,"QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
    pPVar8 = QMakeEvaluator::valuesRef(&pQVar12->super_QMakeEvaluator,(ProKey *)local_88);
    if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
           (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
           + -1;
      UNLOCK();
      if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
          == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if ((pPVar8->super_QList<ProString>).d.size != 0) {
      pQVar7 = (QTextStream *)QTextStream::operator<<(t,"\t");
      QVar15.m_data = (storage_type *)0x2;
      QVar15.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar15);
      local_f8.d.d = (Data *)local_88._0_8_;
      local_f8.d.ptr = (char16_t *)local_88._8_8_;
      local_f8.d.size = local_88._16_8_;
      ProStringList::join((QString *)local_88,pPVar8,&local_f8);
      pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_88);
      Qt::endl(pQVar7);
      if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>).
             _M_i + -1;
        UNLOCK();
        if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_f8.d.d != (QMakeProject *)0x0) {
        LOCK();
        (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
        super___atomic_base<int>)._M_i =
             (((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
             super___atomic_base<int>)._M_i + -1;
        UNLOCK();
        if ((((Type *)&((QMakeEvaluator *)&(local_f8.d.d)->super_QArrayData)->m_caller)->
            super___atomic_base<int>)._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((QMakeLocalFileName *)local_148.super_ProString.m_string.d.size != (QMakeLocalFileName *)0x0
       ) {
      lVar10 = 0;
      pQVar11 = (QMakeLocalFileName *)0x0;
      do {
        if (*(int *)((long)((long)local_148.super_ProString.m_string.d.ptr + 0x1c) + lVar10) != 0) {
          pQVar7 = operator<<(t,(ProString *)
                                ((long)&(((Type *)&(((QString *)
                                                    local_148.super_ProString.m_string.d.ptr)->d).d)
                                        ->super___atomic_base<int>)._M_i + lVar10));
          QTextStream::operator<<(pQVar7,":\n");
        }
        pQVar11 = (QMakeLocalFileName *)((long)&(pQVar11->real_name).d.d + 1);
        lVar10 = lVar10 + 0x30;
      } while (pQVar11 < (ulong)local_148.super_ProString.m_string.d.size);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_148);
  }
  cVar6 = (char)uVar9;
  pQVar12 = this->project;
  ProKey::ProKey(&local_148,"QMAKE_ORIG_TARGET");
  QMakeEvaluator::first((ProString *)local_88,&pQVar12->super_QMakeEvaluator,&local_148);
  bVar5 = ProString::operator==((ProString *)local_88,"qmake");
  if ((QMakeProject *)local_88._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i =
         (((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i +
         -1;
    UNLOCK();
    if ((((Type *)&((QMakeEvaluator *)local_88._0_8_)->m_caller)->super___atomic_base<int>)._M_i ==
        0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,"qmake: FORCE\n\t@");
    pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_d8);
    pQVar7 = (QTextStream *)Qt::endl(pQVar7);
    Qt::endl(pQVar7);
    if (cVar6 == '\0') {
      QTextStream::operator<<(t,"qmake_all: FORCE\n\n");
    }
  }
  if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeMakeQmake(QTextStream &t, bool noDummyQmakeAll)
{
    QString ofile = fileFixify(Option::output.fileName());
    if(project->isEmpty("QMAKE_FAILED_REQUIREMENTS") && !project->isEmpty("QMAKE_INTERNAL_PRL_FILE")) {
        QStringList files = escapeFilePaths(fileFixify(Option::mkfile::project_files));
        t << escapeDependencyPath(project->first("QMAKE_INTERNAL_PRL_FILE").toQString()) << ": \n\t"
          << "@$(QMAKE) -prl " << files.join(' ') << ' ' << buildArgs(true) << Qt::endl;
    }

        QString qmake = "$(QMAKE)" + fullBuildArgs();
        if(!ofile.isEmpty() && !project->isActiveConfig("no_autoqmake")) {
            t << escapeDependencyPath(ofile) << ": "
              << escapeDependencyPath(fileFixify(project->projectFile())) << " ";
            if (Option::globals->do_cache) {
                if (!project->confFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->confFile())) << " ";
                if (!project->cacheFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->cacheFile())) << " ";
            }
            if(!specdir().isEmpty()) {
                if (exists(Option::normalizePath(specdir() + "/qmake.conf")))
                    t << escapeDependencyPath(specdir() + Option::dir_sep + "qmake.conf") << " ";
            }
            const ProStringList &included = escapeDependencyPaths(project->values("QMAKE_INTERNAL_INCLUDED_FILES"));
            t << included.join(QString(" \\\n\t\t")) << "\n\t"
              << qmake << Qt::endl;
            const ProStringList &extraCommands = project->values("QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
            if (!extraCommands.isEmpty())
                t << "\t" << extraCommands.join(QString("\n\t")) << Qt::endl;
            for(int include = 0; include < included.size(); ++include) {
                const ProString &i = included.at(include);
                if(!i.isEmpty())
                    t << i << ":\n";
            }
        }
        if(project->first("QMAKE_ORIG_TARGET") != "qmake") {
            t << "qmake: FORCE\n\t@" << qmake << Qt::endl << Qt::endl;
            if (!noDummyQmakeAll)
                t << "qmake_all: FORCE\n\n";
        }
}